

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

kp_error_t help(kp_ctx *ctx,int argc,char **argv)

{
  kp_cmd *pkVar1;
  char *in_RDX;
  int in_ESI;
  kp_cmd *cmd;
  kp_error_t local_4;
  
  if (_optind < in_ESI) {
    pkVar1 = find_command(in_RDX);
    printf("usage: %s %s\n\n",___progname,pkVar1->opts);
    if (pkVar1->usage != (_func_void *)0x0) {
      (*pkVar1->usage)();
    }
    local_4 = 0;
  }
  else {
    usage();
    local_4 = 2;
  }
  return local_4;
}

Assistant:

static kp_error_t
help(struct kp_ctx *ctx, int argc, char **argv)
{
	extern char *__progname;
	struct kp_cmd *cmd;

	if (optind >= argc) {
		usage();
		return KP_EINPUT;
	}

	cmd = find_command(argv[optind]);

	printf("usage: %s %s\n"
	       "\n", __progname, cmd->opts);
	if (cmd->usage) cmd->usage();

	return KP_SUCCESS;
}